

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O2

void * gtemplate_new_old(t_symbol *s,int argc,t_atom *argv)

{
  _glist *p_Var1;
  t_symbol *sym;
  void *pvVar2;
  
  p_Var1 = canvas_getcurrent();
  sym = canvas_makebindsym(p_Var1->gl_name);
  if (gtemplate_new_old_warned == '\0') {
    post("warning -- \'template\' (%s) is obsolete; replace with \'struct\'",sym->s_name);
    gtemplate_new_old_warned = '\x01';
  }
  pvVar2 = gtemplate_donew(sym,argc,argv);
  return pvVar2;
}

Assistant:

static void *gtemplate_new_old(t_symbol *s, int argc, t_atom *argv)
{
    t_symbol *sym = canvas_makebindsym(canvas_getcurrent()->gl_name);
    static int warned;
    if (!warned)
    {
        post("warning -- 'template' (%s) is obsolete; replace with 'struct'",
            sym->s_name);
        warned = 1;
    }
    return (gtemplate_donew(sym, argc, argv));
}